

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O3

void Eigen::internal::
     general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<double,_long,_0> *alhs,
          const_blas_data_mapper<double,_long,_1> *rhs,ResScalar *res,long resIncr,double alpha)

{
  double dVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  double *pdVar18;
  double *pdVar19;
  double *pdVar20;
  double *pdVar21;
  double *pdVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double *local_98;
  double *local_90;
  double *local_80;
  
  lVar2 = (alhs->super_blas_data_mapper<const_double,_long,_0,_0,_1>).m_stride;
  lVar16 = 4;
  if ((ulong)(lVar2 * 8) < 32000) {
    lVar16 = 0x10;
  }
  if (cols < 0x80) {
    lVar16 = cols;
  }
  if (0 < cols) {
    local_90 = (alhs->super_blas_data_mapper<const_double,_long,_0,_0,_1>).m_data;
    pdVar20 = local_90 + 0xe;
    lVar14 = lVar2 * lVar16;
    local_98 = local_90 + 4;
    local_80 = local_90 + 2;
    lVar10 = 0;
    lVar12 = 0;
    do {
      lVar11 = lVar16 + lVar12;
      lVar13 = cols;
      if (lVar11 < cols) {
        lVar13 = lVar11;
      }
      if (rows < 0x10) {
        uVar15 = 0;
      }
      else {
        uVar15 = 0;
        pdVar18 = pdVar20;
        do {
          lVar3 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_stride;
          pdVar21 = (double *)
                    (lVar10 * lVar3 +
                    (long)(rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_data);
          dVar37 = 0.0;
          dVar38 = 0.0;
          dVar35 = 0.0;
          dVar36 = 0.0;
          dVar33 = 0.0;
          dVar34 = 0.0;
          dVar31 = 0.0;
          dVar32 = 0.0;
          dVar29 = 0.0;
          dVar30 = 0.0;
          dVar27 = 0.0;
          dVar28 = 0.0;
          dVar25 = 0.0;
          dVar26 = 0.0;
          dVar23 = 0.0;
          dVar24 = 0.0;
          pdVar22 = pdVar18;
          lVar17 = lVar12;
          do {
            dVar1 = *pdVar21;
            dVar37 = dVar37 + pdVar22[-0xe] * dVar1;
            dVar38 = dVar38 + pdVar22[-0xd] * dVar1;
            dVar35 = dVar35 + pdVar22[-0xc] * dVar1;
            dVar36 = dVar36 + pdVar22[-0xb] * dVar1;
            dVar33 = dVar33 + pdVar22[-10] * dVar1;
            dVar34 = dVar34 + pdVar22[-9] * dVar1;
            dVar31 = dVar31 + pdVar22[-8] * dVar1;
            dVar32 = dVar32 + pdVar22[-7] * dVar1;
            dVar29 = dVar29 + pdVar22[-6] * dVar1;
            dVar30 = dVar30 + pdVar22[-5] * dVar1;
            dVar27 = dVar27 + pdVar22[-4] * dVar1;
            dVar28 = dVar28 + pdVar22[-3] * dVar1;
            dVar25 = dVar25 + pdVar22[-2] * dVar1;
            dVar26 = dVar26 + pdVar22[-1] * dVar1;
            dVar23 = dVar23 + *pdVar22 * dVar1;
            dVar24 = dVar24 + pdVar22[1] * dVar1;
            lVar17 = lVar17 + 1;
            pdVar21 = pdVar21 + lVar3;
            pdVar22 = pdVar22 + lVar2;
          } while (lVar17 < lVar13);
          dVar1 = (res + uVar15)[1];
          dVar4 = res[uVar15 + 2];
          dVar5 = (res + uVar15 + 2)[1];
          dVar6 = res[uVar15 + 4];
          dVar7 = (res + uVar15 + 4)[1];
          dVar8 = res[uVar15 + 6];
          dVar9 = (res + uVar15 + 6)[1];
          res[uVar15] = res[uVar15] + dVar37 * alpha;
          (res + uVar15)[1] = dVar1 + dVar38 * alpha;
          res[uVar15 + 2] = dVar35 * alpha + dVar4;
          (res + uVar15 + 2)[1] = dVar36 * alpha + dVar5;
          res[uVar15 + 4] = dVar33 * alpha + dVar6;
          (res + uVar15 + 4)[1] = dVar34 * alpha + dVar7;
          res[uVar15 + 6] = dVar31 * alpha + dVar8;
          (res + uVar15 + 6)[1] = dVar32 * alpha + dVar9;
          dVar31 = (res + uVar15 + 8)[1];
          res[uVar15 + 8] = dVar29 * alpha + res[uVar15 + 8];
          (res + uVar15 + 8)[1] = dVar30 * alpha + dVar31;
          dVar29 = (res + uVar15 + 10)[1];
          res[uVar15 + 10] = dVar27 * alpha + res[uVar15 + 10];
          (res + uVar15 + 10)[1] = dVar28 * alpha + dVar29;
          dVar27 = (res + uVar15 + 0xc)[1];
          res[uVar15 + 0xc] = dVar25 * alpha + res[uVar15 + 0xc];
          (res + uVar15 + 0xc)[1] = dVar26 * alpha + dVar27;
          dVar25 = (res + uVar15 + 0xe)[1];
          res[uVar15 + 0xe] = dVar23 * alpha + res[uVar15 + 0xe];
          (res + uVar15 + 0xe)[1] = dVar24 * alpha + dVar25;
          uVar15 = uVar15 + 0x10;
          pdVar18 = pdVar18 + 0x10;
        } while ((long)uVar15 < rows + -0xf);
      }
      if ((long)uVar15 < rows + -7) {
        lVar3 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_stride;
        pdVar22 = (double *)
                  (lVar3 * lVar10 +
                  (long)(rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_data);
        pdVar18 = local_98 + uVar15;
        dVar29 = 0.0;
        dVar30 = 0.0;
        dVar27 = 0.0;
        dVar28 = 0.0;
        dVar25 = 0.0;
        dVar26 = 0.0;
        dVar23 = 0.0;
        dVar24 = 0.0;
        lVar17 = lVar12;
        do {
          dVar31 = *pdVar22;
          dVar29 = dVar29 + pdVar18[-4] * dVar31;
          dVar30 = dVar30 + pdVar18[-3] * dVar31;
          dVar27 = dVar27 + pdVar18[-2] * dVar31;
          dVar28 = dVar28 + pdVar18[-1] * dVar31;
          dVar25 = dVar25 + *pdVar18 * dVar31;
          dVar26 = dVar26 + pdVar18[1] * dVar31;
          dVar23 = dVar23 + pdVar18[2] * dVar31;
          dVar24 = dVar24 + pdVar18[3] * dVar31;
          lVar17 = lVar17 + 1;
          pdVar22 = pdVar22 + lVar3;
          pdVar18 = pdVar18 + lVar2;
        } while (lVar17 < lVar13);
        dVar31 = (res + uVar15)[1];
        dVar32 = res[uVar15 + 2];
        dVar33 = (res + uVar15 + 2)[1];
        dVar34 = res[uVar15 + 4];
        dVar35 = (res + uVar15 + 4)[1];
        dVar36 = res[uVar15 + 6];
        dVar37 = (res + uVar15 + 6)[1];
        res[uVar15] = res[uVar15] + dVar29 * alpha;
        (res + uVar15)[1] = dVar31 + dVar30 * alpha;
        res[uVar15 + 2] = dVar27 * alpha + dVar32;
        (res + uVar15 + 2)[1] = dVar28 * alpha + dVar33;
        res[uVar15 + 4] = dVar25 * alpha + dVar34;
        (res + uVar15 + 4)[1] = dVar26 * alpha + dVar35;
        res[uVar15 + 6] = dVar23 * alpha + dVar36;
        (res + uVar15 + 6)[1] = dVar24 * alpha + dVar37;
        uVar15 = uVar15 | 8;
      }
      if ((long)uVar15 < rows + -5) {
        lVar3 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_stride;
        pdVar22 = (double *)
                  (lVar3 * lVar10 +
                  (long)(rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_data);
        dVar27 = 0.0;
        dVar28 = 0.0;
        dVar25 = 0.0;
        dVar26 = 0.0;
        dVar23 = 0.0;
        dVar24 = 0.0;
        pdVar18 = local_98;
        lVar17 = lVar12;
        do {
          dVar29 = *pdVar22;
          dVar27 = dVar27 + pdVar18[uVar15 - 4] * dVar29;
          dVar28 = dVar28 + (pdVar18 + (uVar15 - 4))[1] * dVar29;
          dVar25 = dVar25 + pdVar18[uVar15 - 2] * dVar29;
          dVar26 = dVar26 + (pdVar18 + (uVar15 - 2))[1] * dVar29;
          dVar23 = dVar23 + pdVar18[uVar15] * dVar29;
          dVar24 = dVar24 + (pdVar18 + uVar15)[1] * dVar29;
          lVar17 = lVar17 + 1;
          pdVar22 = pdVar22 + lVar3;
          pdVar18 = pdVar18 + lVar2;
        } while (lVar17 < lVar13);
        dVar29 = (res + uVar15)[1];
        dVar30 = res[uVar15 + 2];
        dVar31 = (res + uVar15 + 2)[1];
        dVar32 = res[uVar15 + 4];
        dVar33 = (res + uVar15 + 4)[1];
        res[uVar15] = res[uVar15] + dVar27 * alpha;
        (res + uVar15)[1] = dVar29 + dVar28 * alpha;
        res[uVar15 + 2] = dVar25 * alpha + dVar30;
        (res + uVar15 + 2)[1] = dVar26 * alpha + dVar31;
        res[uVar15 + 4] = dVar23 * alpha + dVar32;
        (res + uVar15 + 4)[1] = dVar24 * alpha + dVar33;
        uVar15 = uVar15 + 6;
      }
      if ((long)uVar15 < rows + -3) {
        lVar3 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_stride;
        pdVar22 = (double *)
                  (lVar3 * lVar10 +
                  (long)(rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_data);
        dVar23 = 0.0;
        dVar24 = 0.0;
        dVar25 = 0.0;
        dVar26 = 0.0;
        pdVar18 = local_80;
        lVar17 = lVar12;
        do {
          dVar27 = *pdVar22;
          dVar25 = dVar25 + pdVar18[uVar15 - 2] * dVar27;
          dVar26 = dVar26 + (pdVar18 + (uVar15 - 2))[1] * dVar27;
          dVar23 = dVar23 + pdVar18[uVar15] * dVar27;
          dVar24 = dVar24 + (pdVar18 + uVar15)[1] * dVar27;
          lVar17 = lVar17 + 1;
          pdVar22 = pdVar22 + lVar3;
          pdVar18 = pdVar18 + lVar2;
        } while (lVar17 < lVar13);
        dVar27 = (res + uVar15)[1];
        dVar28 = res[uVar15 + 2];
        dVar29 = (res + uVar15 + 2)[1];
        res[uVar15] = res[uVar15] + dVar25 * alpha;
        (res + uVar15)[1] = dVar27 + dVar26 * alpha;
        res[uVar15 + 2] = dVar23 * alpha + dVar28;
        (res + uVar15 + 2)[1] = dVar24 * alpha + dVar29;
        uVar15 = uVar15 + 4;
      }
      if ((long)uVar15 < rows + -1) {
        lVar3 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_stride;
        pdVar22 = (double *)
                  (lVar3 * lVar10 +
                  (long)(rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_data);
        pdVar18 = local_90 + uVar15;
        dVar23 = 0.0;
        dVar24 = 0.0;
        lVar17 = lVar12;
        do {
          dVar23 = dVar23 + *pdVar18 * *pdVar22;
          dVar24 = dVar24 + pdVar18[1] * *pdVar22;
          lVar17 = lVar17 + 1;
          pdVar22 = pdVar22 + lVar3;
          pdVar18 = pdVar18 + lVar2;
        } while (lVar17 < lVar13);
        dVar25 = (res + uVar15)[1];
        res[uVar15] = dVar23 * alpha + res[uVar15];
        (res + uVar15)[1] = dVar24 * alpha + dVar25;
        uVar15 = uVar15 + 2;
      }
      if ((long)uVar15 < rows) {
        lVar3 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_stride;
        pdVar22 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_data;
        pdVar18 = local_90 + uVar15;
        do {
          dVar23 = 0.0;
          lVar17 = lVar12;
          pdVar21 = (double *)(lVar3 * lVar10 + (long)pdVar22);
          pdVar19 = pdVar18;
          do {
            dVar23 = dVar23 + *pdVar19 * *pdVar21;
            lVar17 = lVar17 + 1;
            pdVar21 = pdVar21 + lVar3;
            pdVar19 = pdVar19 + lVar2;
          } while (lVar17 < lVar13);
          res[uVar15] = dVar23 * alpha + res[uVar15];
          uVar15 = uVar15 + 1;
          pdVar18 = pdVar18 + 1;
        } while (uVar15 != rows);
      }
      lVar10 = lVar10 + lVar16 * 8;
      pdVar20 = pdVar20 + lVar14;
      local_98 = local_98 + lVar14;
      local_80 = local_80 + lVar14;
      local_90 = local_90 + lVar14;
      lVar12 = lVar11;
    } while (lVar11 < cols);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,ColMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
        ResScalar* res, Index resIncr,
  RhsScalar alpha)
{
  EIGEN_UNUSED_VARIABLE(resIncr);
  eigen_internal_assert(resIncr==1);

  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  conj_helper<LhsPacketHalf,RhsPacketHalf,ConjugateLhs,ConjugateRhs> pcj_half;
  conj_helper<LhsPacketQuarter,RhsPacketQuarter,ConjugateLhs,ConjugateRhs> pcj_quarter;

  const Index lhsStride = lhs.stride();
  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned,
         ResPacketSize = Traits::ResPacketSize,
         ResPacketSizeHalf = HalfTraits::ResPacketSize,
         ResPacketSizeQuarter = QuarterTraits::ResPacketSize,
         LhsPacketSize = Traits::LhsPacketSize,
         HasHalf = (int)ResPacketSizeHalf < (int)ResPacketSize,
         HasQuarter = (int)ResPacketSizeQuarter < (int)ResPacketSizeHalf
  };

  const Index n8 = rows-8*ResPacketSize+1;
  const Index n4 = rows-4*ResPacketSize+1;
  const Index n3 = rows-3*ResPacketSize+1;
  const Index n2 = rows-2*ResPacketSize+1;
  const Index n1 = rows-1*ResPacketSize+1;
  const Index n_half = rows-1*ResPacketSizeHalf+1;
  const Index n_quarter = rows-1*ResPacketSizeQuarter+1;

  // TODO: improve the following heuristic:
  const Index block_cols = cols<128 ? cols : (lhsStride*sizeof(LhsScalar)<32000?16:4);
  ResPacket palpha = pset1<ResPacket>(alpha);
  ResPacketHalf palpha_half = pset1<ResPacketHalf>(alpha);
  ResPacketQuarter palpha_quarter = pset1<ResPacketQuarter>(alpha);

  for(Index j2=0; j2<cols; j2+=block_cols)
  {
    Index jend = numext::mini(j2+block_cols,cols);
    Index i=0;
    for(; i<n8; i+=ResPacketSize*8)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0)),
                c3 = pset1<ResPacket>(ResScalar(0)),
                c4 = pset1<ResPacket>(ResScalar(0)),
                c5 = pset1<ResPacket>(ResScalar(0)),
                c6 = pset1<ResPacket>(ResScalar(0)),
                c7 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
        c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*3,j),b0,c3);
        c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*4,j),b0,c4);
        c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*5,j),b0,c5);
        c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*6,j),b0,c6);
        c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*7,j),b0,c7);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));
      pstoreu(res+i+ResPacketSize*3, pmadd(c3,palpha,ploadu<ResPacket>(res+i+ResPacketSize*3)));
      pstoreu(res+i+ResPacketSize*4, pmadd(c4,palpha,ploadu<ResPacket>(res+i+ResPacketSize*4)));
      pstoreu(res+i+ResPacketSize*5, pmadd(c5,palpha,ploadu<ResPacket>(res+i+ResPacketSize*5)));
      pstoreu(res+i+ResPacketSize*6, pmadd(c6,palpha,ploadu<ResPacket>(res+i+ResPacketSize*6)));
      pstoreu(res+i+ResPacketSize*7, pmadd(c7,palpha,ploadu<ResPacket>(res+i+ResPacketSize*7)));
    }
    if(i<n4)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0)),
                c3 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
        c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*3,j),b0,c3);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));
      pstoreu(res+i+ResPacketSize*3, pmadd(c3,palpha,ploadu<ResPacket>(res+i+ResPacketSize*3)));

      i+=ResPacketSize*4;
    }
    if(i<n3)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));

      i+=ResPacketSize*3;
    }
    if(i<n2)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      i+=ResPacketSize*2;
    }
    if(i<n1)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      i+=ResPacketSize;
    }
    if(HasHalf && i<n_half)
    {
      ResPacketHalf c0 = pset1<ResPacketHalf>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacketHalf b0 = pset1<RhsPacketHalf>(rhs(j,0));
        c0 = pcj_half.pmadd(lhs.template load<LhsPacketHalf,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSizeHalf*0, pmadd(c0,palpha_half,ploadu<ResPacketHalf>(res+i+ResPacketSizeHalf*0)));
      i+=ResPacketSizeHalf;
    }
    if(HasQuarter && i<n_quarter)
    {
      ResPacketQuarter c0 = pset1<ResPacketQuarter>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacketQuarter b0 = pset1<RhsPacketQuarter>(rhs(j,0));
        c0 = pcj_quarter.pmadd(lhs.template load<LhsPacketQuarter,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSizeQuarter*0, pmadd(c0,palpha_quarter,ploadu<ResPacketQuarter>(res+i+ResPacketSizeQuarter*0)));
      i+=ResPacketSizeQuarter;
    }
    for(;i<rows;++i)
    {
      ResScalar c0(0);
      for(Index j=j2; j<jend; j+=1)
        c0 += cj.pmul(lhs(i,j), rhs(j,0));
      res[i] += alpha*c0;
    }
  }
}